

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O3

BufferHandle * __thiscall
duckdb::CachingFileHandle::TryReadFromFileRange
          (BufferHandle *__return_storage_ptr__,CachingFileHandle *this,
          unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
          *guard,CachedFileRange *file_range,data_ptr_t *buffer,idx_t nr_bytes,idx_t location)

{
  BufferManager *pBVar1;
  bool bVar2;
  BlockHandle *pBVar3;
  
  pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&file_range->block_handle);
  if ((pBVar3->state)._M_i == BLOCK_UNLOADED) {
    BufferHandle::BufferHandle(__return_storage_ptr__);
  }
  else {
    pBVar1 = this->external_file_cache->buffer_manager;
    (*pBVar1->_vptr_BufferManager[7])(__return_storage_ptr__,pBVar1,file_range);
    bVar2 = BufferHandle::IsValid(__return_storage_ptr__);
    if (bVar2) {
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&__return_storage_ptr__->node);
      *buffer = ((__return_storage_ptr__->node).ptr)->buffer + (location - file_range->location);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BufferHandle CachingFileHandle::TryReadFromFileRange(const unique_ptr<StorageLockKey> &guard,
                                                     CachedFileRange &file_range, data_ptr_t &buffer, idx_t nr_bytes,
                                                     idx_t location) {
	D_ASSERT(file_range.GetOverlap(nr_bytes, location) == CachedFileRangeOverlap::FULL);
	if (file_range.block_handle->IsUnloaded()) {
		return BufferHandle(); // Purely in-memory (for now)
	}
	auto result = external_file_cache.GetBufferManager().Pin(file_range.block_handle);
	if (result.IsValid()) {
		buffer = result.Ptr() + (location - file_range.location);
	}
	return result;
}